

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t pax_attribute_LIBARCHIVE_xattr
                  (archive_entry *entry,char *name,size_t name_length,char *value,
                  size_t value_length)

{
  size_t local_50;
  size_t value_len;
  void *value_decoded;
  char *name_decoded;
  size_t value_length_local;
  char *value_local;
  size_t name_length_local;
  char *name_local;
  archive_entry *entry_local;
  
  if (name_length == 0) {
    entry_local._4_4_ = L'\x03';
  }
  else {
    name_decoded = (char *)value_length;
    value_length_local = (size_t)value;
    value_local = (char *)name_length;
    name_length_local = (size_t)name;
    name_local = (char *)entry;
    value_decoded = url_decode(name,name_length);
    if ((char *)value_decoded == (char *)0x0) {
      entry_local._4_4_ = L'\x02';
    }
    else {
      value_len = (size_t)base64_decode((char *)value_length_local,(size_t)name_decoded,&local_50);
      if ((char *)value_len == (char *)0x0) {
        free(value_decoded);
        entry_local._4_4_ = L'\x01';
      }
      else {
        archive_entry_xattr_add_entry
                  ((archive_entry *)name_local,(char *)value_decoded,(void *)value_len,local_50);
        free(value_decoded);
        free((void *)value_len);
        entry_local._4_4_ = L'\0';
      }
    }
  }
  return entry_local._4_4_;
}

Assistant:

static int
pax_attribute_LIBARCHIVE_xattr(struct archive_entry *entry,
	const char *name, size_t name_length, const char *value, size_t value_length)
{
	char *name_decoded;
	void *value_decoded;
	size_t value_len;

	if (name_length < 1)
		return 3;

	/* URL-decode name */
	name_decoded = url_decode(name, name_length);
	if (name_decoded == NULL)
		return 2;

	/* Base-64 decode value */
	value_decoded = base64_decode(value, value_length, &value_len);
	if (value_decoded == NULL) {
		free(name_decoded);
		return 1;
	}

	archive_entry_xattr_add_entry(entry, name_decoded,
		value_decoded, value_len);

	free(name_decoded);
	free(value_decoded);
	return 0;
}